

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O1

void __thiscall pbrt::StatsAccumulator::StatsAccumulator(StatsAccumulator *this)

{
  Stats *pSVar1;
  _Rb_tree_header *p_Var2;
  memory_resource *pmVar3;
  memory_resource *pmVar4;
  
  this->stats = (Stats *)0x0;
  pSVar1 = (Stats *)operator_new(0x2c8);
  p_Var2 = &(pSVar1->counters)._M_t._M_impl.super__Rb_tree_header;
  (pSVar1->counters)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pSVar1->counters)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pSVar1->counters)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (pSVar1->counters)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (pSVar1->counters)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(pSVar1->memoryCounters)._M_t._M_impl.super__Rb_tree_header;
  (pSVar1->memoryCounters)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pSVar1->memoryCounters)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pSVar1->memoryCounters)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header
  ;
  (pSVar1->memoryCounters)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (pSVar1->memoryCounters)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(pSVar1->intDistributions)._M_t._M_impl.super__Rb_tree_header;
  (pSVar1->intDistributions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pSVar1->intDistributions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (pSVar1->intDistributions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (pSVar1->intDistributions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (pSVar1->intDistributions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(pSVar1->floatDistributions)._M_t._M_impl.super__Rb_tree_header;
  (pSVar1->floatDistributions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pSVar1->floatDistributions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (pSVar1->floatDistributions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (pSVar1->floatDistributions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (pSVar1->floatDistributions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(pSVar1->percentages)._M_t._M_impl.super__Rb_tree_header;
  (pSVar1->percentages)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pSVar1->percentages)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pSVar1->percentages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (pSVar1->percentages)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (pSVar1->percentages)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(pSVar1->ratios)._M_t._M_impl.super__Rb_tree_header;
  (pSVar1->ratios)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pSVar1->ratios)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pSVar1->ratios)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (pSVar1->ratios)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (pSVar1->ratios)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(pSVar1->rareChecks)._M_t._M_impl.super__Rb_tree_header;
  (pSVar1->rareChecks)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pSVar1->rareChecks)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pSVar1->rareChecks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (pSVar1->rareChecks)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (pSVar1->rareChecks)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pmVar3 = pstd::pmr::new_delete_resource();
  (pSVar1->pixelTime).format = U256;
  (pSVar1->pixelTime).resolution.super_Tuple2<pbrt::Point2,_int>.x = 0;
  (pSVar1->pixelTime).resolution.super_Tuple2<pbrt::Point2,_int>.y = 0;
  pmVar4 = pstd::pmr::new_delete_resource();
  (pSVar1->pixelTime).channelNames.alloc.memoryResource = pmVar4;
  (pSVar1->pixelTime).channelNames.ptr =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  (pSVar1->pixelTime).channelNames.nAlloc = 0;
  (pSVar1->pixelTime).channelNames.nStored = 0;
  (pSVar1->pixelTime).encoding.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = 0;
  (pSVar1->pixelTime).p8.alloc.memoryResource = pmVar3;
  (pSVar1->pixelTime).p8.ptr = (uchar *)0x0;
  (pSVar1->pixelTime).p8.nAlloc = 0;
  (pSVar1->pixelTime).p8.nStored = 0;
  (pSVar1->pixelTime).p16.alloc.memoryResource = pmVar3;
  (pSVar1->pixelTime).p16.ptr = (Half *)0x0;
  (pSVar1->pixelTime).p16.nAlloc = 0;
  (pSVar1->pixelTime).p16.nStored = 0;
  (pSVar1->pixelTime).p32.alloc.memoryResource = pmVar3;
  *(undefined1 (*) [64])&(pSVar1->pixelTime).p32.ptr = ZEXT464(0) << 0x40;
  *(undefined1 (*) [64])
   &(pSVar1->pixelCounterImages).super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>.
    _M_impl.super__Vector_impl_data._M_finish = ZEXT464(0) << 0x40;
  this->stats = pSVar1;
  return;
}

Assistant:

StatsAccumulator::StatsAccumulator() {
    stats = new Stats;
}